

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::Persistence_landscape::operator*=
          (Persistence_landscape *__return_storage_ptr__,Persistence_landscape *this,double x)

{
  Persistence_landscape local_48;
  double local_20;
  double x_local;
  Persistence_landscape *this_local;
  
  local_20 = x;
  x_local = (double)this;
  this_local = __return_storage_ptr__;
  operator*(&local_48,this,x);
  operator=(this,&local_48);
  ~Persistence_landscape(&local_48);
  Persistence_landscape(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Persistence_landscape operator*=(double x) {
    *this = *this * x;
    return *this;
  }